

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

void __thiscall gl4cts::ClipControlOriginTest::deinit(ClipControlOriginTest *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  API api;
  ClipControlApi cc;
  ClipControlApi local_28;
  long lVar3;
  
  ClipControlRenderBaseTest::deinit(&this->super_ClipControlRenderBaseTest);
  iVar2 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  api = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api;
  if (api != API_GL_45core) {
    if (api != API_GL_ARB_clip_control) goto LAB_00a354f9;
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                        super_TestCase.m_context)->m_contextInfo,"GL_ARB_clip_control");
    if (!bVar1) goto LAB_00a354f9;
    api = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api;
  }
  ClipControlApi::ClipControlApi
            (&local_28,
             (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
             m_context,api);
  (*local_28.clipControl)(0x8ca1,0x935e);
LAB_00a354f9:
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0);
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
  }
  if (this->m_vbo != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_vbo);
  }
  return;
}

Assistant:

void deinit()
	{
		ClipControlRenderBaseTest::deinit();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		if (ClipControlApi::Supported(m_context, m_api))
		{
			ClipControlApi cc(m_context, m_api);
			cc.clipControl(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE);
		}

		gl.clearColor(0.0, 0.0, 0.0, 0.0);
		if (m_vao)
		{
			gl.deleteVertexArrays(1, &m_vao);
		}
		if (m_vbo)
		{
			gl.deleteBuffers(1, &m_vbo);
		}
	}